

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_heter_queue.h
# Opt level: O0

reentrant_put_transaction<Msg> * __thiscall
density::
lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
::
start_reentrant_emplace<density_tests::LfQueueSamples<(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>::nonblocking_heterogeneous_queue_reentrant_put_transaction_samples()::Msg>
          (reentrant_put_transaction<Msg> *__return_storage_ptr__,
          lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
          *this)

{
  runtime_type<> *prVar1;
  runtime_type<> rVar2;
  reentrant_put_transaction<Msg> local_60;
  runtime_type<> *local_40;
  runtime_type<> *type_storage;
  runtime_type *type;
  Allocation push_data;
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  *this_local;
  
  push_data.m_user_storage = this;
  detail::
  LFQueue_Tail<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::consistency_model)1>
  ::try_inplace_allocate_impl<(density::detail::LfQueue_ProgressGuarantee)0,1ul,true,24ul,8ul>
            ((Allocation *)&type,this);
  type_storage = (runtime_type<> *)0x0;
  prVar1 = detail::
           LFQueue_Base<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
           ::type_after_control((ControlBlock *)type);
  local_40 = prVar1;
  rVar2 = runtime_type<>::
          make<density_tests::LfQueueSamples<(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>::nonblocking_heterogeneous_queue_reentrant_put_transaction_samples()::Msg>
                    ();
  prVar1->m_feature_table = rVar2.m_feature_table;
  type_storage = prVar1;
  memset((void *)push_data.m_next_ptr,0,0x18);
  density_tests::
  LfQueueSamples<(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::nonblocking_heterogeneous_queue_reentrant_put_transaction_samples::Msg::Msg
            ((Msg *)push_data.m_next_ptr);
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::reentrant_put_transaction<Msg>::reentrant_put_transaction
            (&local_60,0,
             (lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
              *)this,(Allocation *)&type);
  reentrant_put_transaction<density_tests::LfQueueSamples<(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>::nonblocking_heterogeneous_queue_reentrant_put_transaction_samples()::Msg>
  ::
  reentrant_put_transaction<density_tests::LfQueueSamples<(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>::nonblocking_heterogeneous_queue_reentrant_put_transaction_samples()::Msg,void>
            ((reentrant_put_transaction<density_tests::LfQueueSamples<(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>::nonblocking_heterogeneous_queue_reentrant_put_transaction_samples()::Msg>
              *)__return_storage_ptr__,&local_60);
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::reentrant_put_transaction<Msg>::~reentrant_put_transaction(&local_60);
  return __return_storage_ptr__;
}

Assistant:

reentrant_put_transaction<ELEMENT_TYPE>
          start_reentrant_emplace(CONSTRUCTION_PARAMS &&... i_construction_params)
        {
            auto push_data = Base::template try_inplace_allocate_impl<
              detail::LfQueue_Throwing,
              detail::LfQueue_Busy,
              true,
              detail::size_of<ELEMENT_TYPE>::value,
              alignof(ELEMENT_TYPE)>();

            runtime_type * type = nullptr;
            try
            {
                auto const type_storage = Base::type_after_control(push_data.m_control_block);
                DENSITY_ASSUME(type_storage != nullptr);
                type = new (type_storage) runtime_type(runtime_type::template make<ELEMENT_TYPE>());

                DENSITY_ASSUME(push_data.m_user_storage != nullptr);
                new (push_data.m_user_storage)
                  ELEMENT_TYPE(std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...);
            }
            catch (...)
            {
                if (type != nullptr)
                    type->RUNTIME_TYPE::~RUNTIME_TYPE();
                Base::cancel_put_nodestroy_impl(push_data);
                throw;
            }

            return reentrant_put_transaction<ELEMENT_TYPE>(PrivateType(), this, push_data);
        }